

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_multi * Curl_multi_handle(int hashsize,int chashsize)

{
  int iVar1;
  Curl_multi *multi;
  int chashsize_local;
  int hashsize_local;
  
  _chashsize_local = (Curl_multi *)(*Curl_ccalloc)(1,0x188);
  if (_chashsize_local == (Curl_multi *)0x0) {
    _chashsize_local = (Curl_multi *)0x0;
  }
  else {
    _chashsize_local->type = 0xbab1e;
    iVar1 = Curl_mk_dnscache(&_chashsize_local->hostcache);
    if (((iVar1 == 0) && (iVar1 = sh_init(&_chashsize_local->sockhash,hashsize), iVar1 == 0)) &&
       (iVar1 = Curl_conncache_init(&_chashsize_local->conn_cache,chashsize), iVar1 == 0)) {
      Curl_llist_init(&_chashsize_local->msglist,multi_freeamsg);
      Curl_llist_init(&_chashsize_local->pending,multi_freeamsg);
      _chashsize_local->maxconnects = -1;
    }
    else {
      Curl_hash_destroy(&_chashsize_local->sockhash);
      Curl_hash_destroy(&_chashsize_local->hostcache);
      Curl_conncache_destroy(&_chashsize_local->conn_cache);
      Curl_llist_destroy(&_chashsize_local->msglist,(void *)0x0);
      Curl_llist_destroy(&_chashsize_local->pending,(void *)0x0);
      (*Curl_cfree)(_chashsize_local);
      _chashsize_local = (Curl_multi *)0x0;
    }
  }
  return _chashsize_local;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize) /* connection hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->type = CURL_MULTI_HANDLE;

  if(Curl_mk_dnscache(&multi->hostcache))
    goto error;

  if(sh_init(&multi->sockhash, hashsize))
    goto error;

  if(Curl_conncache_init(&multi->conn_cache, chashsize))
    goto error;

  Curl_llist_init(&multi->msglist, multi_freeamsg);
  Curl_llist_init(&multi->pending, multi_freeamsg);

  /* -1 means it not set by user, use the default value */
  multi->maxconnects = -1;
  return multi;

  error:

  Curl_hash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_conncache_destroy(&multi->conn_cache);
  Curl_llist_destroy(&multi->msglist, NULL);
  Curl_llist_destroy(&multi->pending, NULL);

  free(multi);
  return NULL;
}